

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::ReferenceContext::deleteTexture(ReferenceContext *this,Texture *texture)

{
  deUint32 dVar1;
  int iVar2;
  deUint32 dVar3;
  size_type sVar4;
  reference pvVar5;
  Framebuffer *local_68;
  Attachment local_50;
  int local_3c;
  Attachment *pAStack_38;
  int refNdx;
  Attachment *attachment;
  int point;
  int releaseRefCount;
  Framebuffer *framebufferBinding;
  int ndx;
  int unitNdx;
  Texture *texture_local;
  ReferenceContext *this_local;
  
  _ndx = (TextureCube *)texture;
  texture_local = (Texture *)this;
  for (framebufferBinding._4_4_ = 0; iVar2 = framebufferBinding._4_4_,
      sVar4 = std::
              vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
              ::size(&this->m_textureUnits), iVar2 < (int)sVar4;
      framebufferBinding._4_4_ = framebufferBinding._4_4_ + 1) {
    pvVar5 = std::
             vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ::operator[](&this->m_textureUnits,(long)framebufferBinding._4_4_);
    if ((TextureCube *)pvVar5->tex1DBinding == _ndx) {
      setTex1DBinding(this,framebufferBinding._4_4_,(Texture1D *)0x0);
    }
    else {
      pvVar5 = std::
               vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
               ::operator[](&this->m_textureUnits,(long)framebufferBinding._4_4_);
      if ((TextureCube *)pvVar5->tex2DBinding == _ndx) {
        setTex2DBinding(this,framebufferBinding._4_4_,(Texture2D *)0x0);
      }
      else {
        pvVar5 = std::
                 vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                 ::operator[](&this->m_textureUnits,(long)framebufferBinding._4_4_);
        if (pvVar5->texCubeBinding == _ndx) {
          setTexCubeBinding(this,framebufferBinding._4_4_,(TextureCube *)0x0);
        }
        else {
          pvVar5 = std::
                   vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                   ::operator[](&this->m_textureUnits,(long)framebufferBinding._4_4_);
          if ((TextureCube *)pvVar5->tex2DArrayBinding == _ndx) {
            setTex2DArrayBinding(this,framebufferBinding._4_4_,(Texture2DArray *)0x0);
          }
          else {
            pvVar5 = std::
                     vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                     ::operator[](&this->m_textureUnits,(long)framebufferBinding._4_4_);
            if ((TextureCube *)pvVar5->tex3DBinding == _ndx) {
              setTex3DBinding(this,framebufferBinding._4_4_,(Texture3D *)0x0);
            }
            else {
              pvVar5 = std::
                       vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                       ::operator[](&this->m_textureUnits,(long)framebufferBinding._4_4_);
              if ((TextureCube *)pvVar5->texCubeArrayBinding == _ndx) {
                setTexCubeArrayBinding(this,framebufferBinding._4_4_,(TextureCubeArray *)0x0);
              }
            }
          }
        }
      }
    }
  }
  for (framebufferBinding._0_4_ = 0; (int)framebufferBinding < 2;
      framebufferBinding._0_4_ = (int)framebufferBinding + 1) {
    if ((int)framebufferBinding == 0) {
      local_68 = this->m_readFramebufferBinding;
    }
    else {
      local_68 = this->m_drawFramebufferBinding;
    }
    _point = local_68;
    if (local_68 != (Framebuffer *)0x0) {
      attachment._4_4_ =
           (uint)(local_68 == this->m_drawFramebufferBinding) +
           (uint)(local_68 == this->m_readFramebufferBinding);
      for (attachment._0_4_ = ATTACHMENTPOINT_COLOR0; (int)(AttachmentPoint)attachment < 3;
          attachment._0_4_ = (AttachmentPoint)attachment + ATTACHMENTPOINT_DEPTH) {
        pAStack_38 = rc::Framebuffer::getAttachment(_point,(AttachmentPoint)attachment);
        dVar1 = pAStack_38->name;
        dVar3 = rc::NamedObject::getName((NamedObject *)_ndx);
        if (dVar1 == dVar3) {
          for (local_3c = 0; local_3c < attachment._4_4_; local_3c = local_3c + 1) {
            releaseFboAttachmentReference(this,pAStack_38);
          }
          rc::Framebuffer::Attachment::Attachment(&local_50);
          pAStack_38->type = local_50.type;
          pAStack_38->name = local_50.name;
          pAStack_38->texTarget = local_50.texTarget;
          pAStack_38->level = local_50.level;
          pAStack_38->layer = local_50.layer;
        }
      }
    }
  }
  rc::ObjectManager<sglr::rc::Texture>::releaseReference(&this->m_textures,&_ndx->super_Texture);
  return;
}

Assistant:

void ReferenceContext::deleteTexture (Texture* texture)
{
	// Unbind from context
	for (int unitNdx = 0; unitNdx < (int)m_textureUnits.size(); unitNdx++)
	{
		if (m_textureUnits[unitNdx].tex1DBinding				== texture)	setTex1DBinding			(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].tex2DBinding			== texture)	setTex2DBinding			(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].texCubeBinding			== texture)	setTexCubeBinding		(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].tex2DArrayBinding		== texture)	setTex2DArrayBinding	(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].tex3DBinding			== texture)	setTex3DBinding			(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].texCubeArrayBinding	== texture)	setTexCubeArrayBinding	(unitNdx, DE_NULL);
	}

	// Unbind from currently bound framebuffers
	for (int ndx = 0; ndx < 2; ndx++)
	{
		rc::Framebuffer* framebufferBinding = ndx ? m_drawFramebufferBinding : m_readFramebufferBinding;
		if (framebufferBinding)
		{
			int releaseRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
								+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
			{
				Framebuffer::Attachment& attachment = framebufferBinding->getAttachment((Framebuffer::AttachmentPoint)point);
				if (attachment.name == texture->getName())
				{
					for (int refNdx = 0; refNdx < releaseRefCount; refNdx++)
						releaseFboAttachmentReference(attachment);
					attachment = Framebuffer::Attachment();
				}
			}
		}
	}

	DE_ASSERT(texture->getRefCount() == 1);
	m_textures.releaseReference(texture);
}